

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O2

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitTypedArrayIndex
          (AsmJSByteCodeGenerator *this,ParseNode *indexNode,OpCodeAsmJs *op,uint32 *indexSlot,
          ViewType viewType,TypedArrayEmitType emitType)

{
  undefined1 *puVar1;
  AsmJsModuleCompiler *pAVar2;
  code *pcVar3;
  bool bVar4;
  OpCode OVar5;
  bool bVar6;
  int iVar7;
  IdentPtr pIVar8;
  AsmJsSymbol *pAVar9;
  AsmJsVar *pAVar10;
  ParseNodeInt *pPVar11;
  ParseNode *this_00;
  ParseNodeFloat *pPVar12;
  EmitExpressionInfo EVar13;
  undefined4 *puVar14;
  AsmJsCompilationException *this_01;
  char16 *pcVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  EmitExpressionInfo local_68;
  EmitExpressionInfo indexInfo;
  EmitExpressionInfo local_58;
  EmitExpressionInfo indexInfo_1;
  uint local_3c;
  
  puVar1 = &this->mCompiler->field_0x2e4;
  *puVar1 = *puVar1 | 0x10;
  OVar5 = indexNode->nop;
  uVar17 = 0;
  bVar4 = false;
  if (OVar5 == knopName) {
    pAVar2 = this->mCompiler;
    indexInfo = (EmitExpressionInfo)op;
    pIVar8 = ParseNode::name(indexNode);
    uVar17 = 0;
    pAVar9 = AsmJsModuleCompiler::LookupIdentifier(pAVar2,pIVar8,this->mFunction,(Source *)0x0);
    if (pAVar9 == (AsmJsSymbol *)0x0) {
      bVar4 = false;
    }
    else {
      uVar17 = 0;
      bVar4 = false;
      if (pAVar9->mType == Variable) {
        iVar7 = (*pAVar9->_vptr_AsmJsSymbol[1])(pAVar9);
        uVar17 = 0;
        bVar4 = false;
        if ((char)iVar7 == '\0') {
          pAVar10 = AsmJsVar::FromSymbol(pAVar9);
          uVar17 = 0;
          bVar4 = false;
          if ((pAVar10->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14 == '\0') {
            uVar17 = (ulong)(uint)(pAVar10->mConstInitialiser).intVal;
            bVar4 = true;
          }
        }
      }
    }
    OVar5 = indexNode->nop;
    op = (OpCodeAsmJs *)indexInfo;
  }
  uVar16 = (uint)uVar17;
  if ((OVar5 == knopInt) || (OVar5 == knopFlt)) {
    if (!bVar4) {
      if (OVar5 == knopInt) {
        pPVar11 = ParseNode::AsParseNodeInt(indexNode);
        uVar17 = (ulong)(uint)pPVar11->lw;
      }
      else {
        bVar4 = ParserWrapper::IsMinInt(indexNode);
        uVar17 = 0x80000000;
        if (!bVar4) {
          bVar4 = ParserWrapper::IsUnsigned(indexNode);
          if (!bVar4) {
            local_68 = Emit(this,indexNode);
            this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
            pcVar15 = AsmJsType::toChars(&local_68.type);
            AsmJsCompilationException::AsmJsCompilationException
                      (this_01,L"Array Index must be intish; %s given",pcVar15);
            goto LAB_00867ca2;
          }
          pPVar12 = ParseNode::AsParseNodeFloat(indexNode);
          uVar17 = (ulong)pPVar12->dbl;
        }
      }
    }
  }
  else if (!bVar4) {
    local_58.super_EmitInfoBase.location = 0xffffffff;
    local_58.type.which_ = Void;
    if (TYPE_UINT8 < viewType && OVar5 != knopRsh) {
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"index expression isn\'t shifted; must be an Int8/Uint8 access");
      goto LAB_00867ca2;
    }
    indexInfo_1 = (EmitExpressionInfo)this;
    if (OVar5 == knopRsh) {
      this_00 = ParserWrapper::GetBinaryRight(indexNode);
      if ((this_00 == (ParseNode *)0x0) || (this_00->nop != knopInt)) {
        this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_01,L"shift amount must be constant");
        goto LAB_00867ca2;
      }
      if (viewType < TYPE_COUNT) {
        uVar18 = *(uint *)(&DAT_00f2d750 + (ulong)viewType * 4);
        local_3c = *(uint *)(&DAT_00f2d78c + (ulong)viewType * 4);
      }
      else {
        AssertCount = AssertCount + 1;
        indexInfo = (EmitExpressionInfo)op;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar14 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0x63e,"((0))","(0)");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar14 = 0;
        local_3c = 0xffffffff;
        uVar18 = 0;
        op = (OpCodeAsmJs *)indexInfo;
      }
      pPVar11 = ParseNode::AsParseNodeInt(this_00);
      if (pPVar11->lw != uVar18) {
        this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_01,L"shift amount must be %d",(ulong)uVar18);
        goto LAB_00867ca2;
      }
      indexNode = ParserWrapper::GetBinaryLeft(indexNode);
      OVar5 = indexNode->nop;
    }
    else {
      local_3c = 0xffffffff;
    }
    EVar13 = indexInfo_1;
    uVar17 = (ulong)emitType;
    if (OVar5 == knopName) {
      pAVar2 = *(AsmJsModuleCompiler **)((long)indexInfo_1 + 0x10);
      pIVar8 = ParseNode::name(indexNode);
      bVar4 = false;
      pAVar9 = AsmJsModuleCompiler::LookupIdentifier
                         (pAVar2,pIVar8,*(AsmJsFunc **)EVar13,(Source *)0x0);
      if (pAVar9 != (AsmJsSymbol *)0x0) {
        if (((pAVar9->mType == Variable) &&
            (iVar7 = (*pAVar9->_vptr_AsmJsSymbol[1])(pAVar9), (char)iVar7 == '\0')) &&
           (pAVar10 = AsmJsVar::FromSymbol(pAVar9),
           (pAVar10->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14 == '\0')) {
          uVar16 = (pAVar10->mConstInitialiser).intVal & local_3c;
          *op = *(OpCodeAsmJs *)((long)&typedArrayOp + uVar17 * 4);
          AsmJsModuleCompiler::UpdateMaxHeapAccess
                    (*(AsmJsModuleCompiler **)((long)indexInfo_1 + 0x10),uVar16);
          bVar4 = true;
        }
        else {
          bVar4 = false;
        }
      }
    }
    else {
      bVar4 = false;
    }
    bVar6 = ParserWrapper::IsUInt(indexNode);
    if (!bVar6) {
      if (bVar4) goto LAB_00867961;
      local_58 = Emit((AsmJSByteCodeGenerator *)indexInfo_1,indexNode);
      bVar4 = AsmJsType::isIntish(&local_58.type);
      if (bVar4) {
        *indexSlot = local_58.super_EmitInfoBase.location;
        *op = *(OpCodeAsmJs *)((long)&typedArrayOp + uVar17 * 4 + 2);
        return local_58;
      }
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      pcVar15 = AsmJsType::toChars(&local_58.type);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"Left operand of >> must be intish; %s given",pcVar15);
      goto LAB_00867ca2;
    }
    uVar16 = ParserWrapper::GetUInt(indexNode);
    uVar16 = uVar16 & local_3c;
    *op = *(OpCodeAsmJs *)((long)&typedArrayOp + uVar17 * 4);
    AsmJsModuleCompiler::UpdateMaxHeapAccess
              (*(AsmJsModuleCompiler **)((long)indexInfo_1 + 0x10),uVar16);
    goto LAB_00867961;
  }
  uVar16 = (uint)uVar17;
  if (viewType - 4 < 3) {
    if (0x3fffffff < uVar16) {
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"Numeric literal for heap32 must be within 0 <= n < 2^30; %d given",
                 uVar17 & 0xffffffff);
LAB_00867ca2:
      __cxa_throw(this_01,&AsmJsCompilationException::typeinfo,0);
    }
    uVar16 = uVar16 << 2;
  }
  else if (viewType - 2 < 2) {
    if ((int)uVar16 < 0) {
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"Numeric literal for heap16 must be within 0 <= n < 2^31; %d given",
                 uVar17 & 0xffffffff);
      goto LAB_00867ca2;
    }
    uVar16 = uVar16 * 2;
  }
  else if (viewType == TYPE_FLOAT64) {
    if (0x1fffffff < uVar16) {
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"Numeric literal for heap64 must be within 0 <= n < 2^29; %d given",
                 uVar17 & 0xffffffff);
      goto LAB_00867ca2;
    }
    uVar16 = uVar16 << 3;
  }
  AsmJsModuleCompiler::UpdateMaxHeapAccess(this->mCompiler,uVar16);
  *op = *(OpCodeAsmJs *)((long)&typedArrayOp + (ulong)emitType * 4);
LAB_00867961:
  *indexSlot = uVar16;
  EVar13.super_EmitInfoBase.location = 0xffffffff;
  EVar13.type.which_ = Void;
  return EVar13;
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitTypedArrayIndex(ParseNode* indexNode, OpCodeAsmJs &op, uint32 &indexSlot, ArrayBufferView::ViewType viewType, TypedArrayEmitType emitType)
    {
        mCompiler->SetUsesHeapBuffer(true);
        bool isConst = false;
        uint32 slot = 0;
        if(indexNode->nop == knopName)
        {
            AsmJsSymbol * declSym = mCompiler->LookupIdentifier(indexNode->name(), mFunction);
            if (AsmJsVar::Is(declSym) && !declSym->isMutable())
            {
                AsmJsVar * definition = AsmJsVar::FromSymbol(declSym);
                if(definition->GetVarType().isInt())
                {
                    slot = (uint32)definition->GetIntInitialiser();
                    isConst = true;
                }
            }
        }
        if (indexNode->nop == knopInt || indexNode->nop == knopFlt || isConst)
        {
            // Emit a different opcode for numerical literal
            if (!isConst)
            {
                if (indexNode->nop == knopInt)
                {
                    slot = (uint32)indexNode->AsParseNodeInt()->lw;
                }
                else if (ParserWrapper::IsMinInt(indexNode))
                {
                    // this is going to be an error, but we can do this to allow it to get same error message as invalid int
                    slot = (uint32)INT32_MIN;
                }
                else if (ParserWrapper::IsUnsigned(indexNode))
                {
                    slot = (uint32)indexNode->AsParseNodeFloat()->dbl;
                }
                else
                {
                    EmitExpressionInfo indexInfo = Emit(indexNode);
                    throw AsmJsCompilationException(_u("Array Index must be intish; %s given"), indexInfo.type.toChars());
                }
            }
            // do the right shift now
            switch( viewType )
            {
            case Js::ArrayBufferView::TYPE_INT16:
            case Js::ArrayBufferView::TYPE_UINT16:
                if (slot & 0x80000000)
                {
                    throw AsmJsCompilationException(_u("Numeric literal for heap16 must be within 0 <= n < 2^31; %d given"), slot);
                }
                slot <<= 1;
                break;
            case Js::ArrayBufferView::TYPE_INT32:
            case Js::ArrayBufferView::TYPE_UINT32:
            case Js::ArrayBufferView::TYPE_FLOAT32:
                if (slot & 0xC0000000)
                {
                    throw AsmJsCompilationException(_u("Numeric literal for heap32 must be within 0 <= n < 2^30; %d given"), slot);
                }
                slot <<= 2;
                break;
            case Js::ArrayBufferView::TYPE_FLOAT64:
                if (slot & 0xE0000000)
                {
                    throw AsmJsCompilationException(_u("Numeric literal for heap64 must be within 0 <= n < 2^29; %d given"), slot);
                }
                slot <<= 3;
                break;
            default:
                break;
            }
            mCompiler->UpdateMaxHeapAccess(slot);
            op = typedArrayOp[emitType][0];
        }
        else
        {
            EmitExpressionInfo indexInfo;
            if (indexNode->nop != knopRsh && viewType != Js::ArrayBufferView::TYPE_INT8 && viewType != Js::ArrayBufferView::TYPE_UINT8)
            {
                throw AsmJsCompilationException( _u("index expression isn't shifted; must be an Int8/Uint8 access") );
            }
            int val = 0;
            uint32 mask = (uint32)~0;
            ParseNode* index;
            if (indexNode->nop == knopRsh)
            {
                ParseNode* rhsNode = ParserWrapper::GetBinaryRight(indexNode);
                if (!rhsNode || rhsNode->nop != knopInt)
                {
                    throw AsmJsCompilationException(_u("shift amount must be constant"));
                }
                switch (viewType)
                {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, irSuffix) \
                case Js::ArrayBufferView::TYPE_##name:\
                    val = align;\
                    mask = ARRAYBUFFER_VIEW_MASK(align);\
                    break;
                #include "AsmJsArrayBufferViews.h"
                default:
                    Assume(UNREACHED);
                }
                if (rhsNode->AsParseNodeInt()->lw != val)
                {
                    throw AsmJsCompilationException(_u("shift amount must be %d"), val);
                }
                index = ParserWrapper::GetBinaryLeft(indexNode);
            }
            else
            {
                index = indexNode;
            }

            isConst = false;
            if (index->nop == knopName)
            {
                AsmJsSymbol * declSym = mCompiler->LookupIdentifier(index->name(), mFunction);
                if (AsmJsVar::Is(declSym) && !declSym->isMutable())
                {
                    AsmJsVar * definition = AsmJsVar::FromSymbol(declSym);
                    if (definition->GetVarType().isInt())
                    {
                        slot = (uint32)definition->GetIntInitialiser();
                        slot &= mask;
                        op = typedArrayOp[emitType][0];
                        isConst = true;
                        mCompiler->UpdateMaxHeapAccess(slot);
                    }
                }
            }
            if( ParserWrapper::IsUInt( index) )
            {
                slot = ParserWrapper::GetUInt(index);
                slot &= mask;
                op = typedArrayOp[emitType][0];

                mCompiler->UpdateMaxHeapAccess(slot);
            }
            else if (!isConst)
            {
                indexInfo = Emit( index );
                if( !indexInfo.type.isIntish() )
                {
                    throw AsmJsCompilationException( _u("Left operand of >> must be intish; %s given"), indexInfo.type.toChars() );
                }
                indexSlot = indexInfo.location;
                op = typedArrayOp[emitType][1];
                return indexInfo;
            }
        }
        indexSlot = slot;
        return EmitExpressionInfo();
    }